

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::DefineUserVars(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  ParseNode *this_01;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  RegSlot tmpReg;
  PropertyId propertyId;
  uint uVar4;
  RegSlot R0;
  FunctionBody *this_02;
  undefined4 *puVar5;
  ParseNodeVar *pPVar6;
  Symbol *this_03;
  FunctionBody *pFVar7;
  Type *pTVar8;
  ushort uVar9;
  Scope *this_04;
  int i;
  int index;
  ParseNodePtr *ppPVar10;
  
  bVar2 = FuncInfo::IsGlobalFunction(funcInfo);
  this_02 = FuncInfo::GetParsedFunctionBody(funcInfo);
  if (bVar2) {
    tmpReg = FuncInfo::AcquireTmpRegister(funcInfo);
  }
  else {
    tmpReg = 0xffffffff;
  }
  ppPVar10 = &funcInfo->root->pnodeVars;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  this_00 = &this->m_writer;
  do {
    this_01 = *ppPVar10;
    if (this_01 == (ParseNode *)0x0) {
      if (tmpReg != 0xffffffff) {
        FuncInfo::ReleaseTmpRegister(funcInfo,tmpReg);
      }
      for (index = 0;
          index < (funcInfo->nonUserNonTempRegistersToInitialize).
                  super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>.count;
          index = index + 1) {
        pTVar8 = JsUtil::
                 List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(&funcInfo->nonUserNonTempRegistersToInitialize,index);
        Js::ByteCodeWriter::Reg1(this_00,LdUndef,*pTVar8);
      }
      return;
    }
    pPVar6 = ParseNode::AsParseNodeVar(this_01);
    this_03 = pPVar6->sym;
    if (this_03 != (Symbol *)0x0) {
      pPVar6 = ParseNode::AsParseNodeVar(this_01);
      if ((pPVar6->isBlockScopeFncDeclVar == '\0') || ((this_03->field_0x42 & 2) == 0)) {
        bVar3 = Symbol::IsSpecialSymbol(this_03);
        if (bVar3) {
          if ((funcInfo->root->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone) {
            EmitPropStoreForSpecialSymbol(this,this_03->location,this_03,this_03->pid,funcInfo,true)
            ;
            bVar3 = ShouldTrackDebuggerMetadata(this);
            if (bVar3) {
              bVar3 = Symbol::IsInSlot(this_03,this,funcInfo,false);
              if (!bVar3) {
                Js::FunctionBody::InsertSymbolToRegSlotList
                          (this_02,&this_03->name,this_03->location,funcInfo->varRegsCount);
              }
            }
          }
        }
        else {
          if (((*(ushort *)&this_03->field_0x42 & 0x40) != 0) ||
             (((*(ushort *)&this_03->field_0x42 & 2) != 0 && (this_01->nop == knopVarDecl)))) {
            bVar3 = Symbol::IsArguments(this_03);
            if (bVar3) {
              if ((funcInfo->field_0xb4 & 8) != 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                   ,0x568,"(!funcInfo->GetHasArguments())",
                                   "!funcInfo->GetHasArguments()");
                if (!bVar3) goto LAB_0075c766;
                *puVar5 = 0;
              }
              goto LAB_0075c701;
            }
            this_04 = funcInfo->bodyScope;
            if (((this_03->field_0x42 & 0x40) == 0) && (this_04 == this_03->scope)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x56e,"(funcInfo->bodyScope != sym->GetScope())",
                                 "funcInfo->bodyScope != sym->GetScope()");
              if (!bVar3) goto LAB_0075c766;
              *puVar5 = 0;
              this_04 = funcInfo->bodyScope;
            }
            this_03 = Scope::FindLocalSymbol(this_04,&this_03->name);
            if ((this_03 == (Symbol *)0x0) || ((this_03->field_0x42 & 0x42) != 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x572,"(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar())",
                                 "sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()");
              if (!bVar3) goto LAB_0075c766;
              *puVar5 = 0;
            }
          }
          if ((this_03->symbolType == STVariable) && ((this_03->field_0x43 & 0x40) == 0)) {
            if (bVar2) {
              propertyId = Symbol::EnsurePosition(this_03,this);
              if ((this->flags & 0x400) == 0) {
                uVar4 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,propertyId);
                Js::ByteCodeWriter::ElementU(this_00,LdElemUndef,0xfffffffd,uVar4);
              }
              else {
                uVar9 = *(ushort *)&(funcInfo->byteCodeFunction->super_FunctionProxy).field_0x45;
                uVar4 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,propertyId);
                if ((uVar9 >> 8 & 1) == 0) {
                  Js::ByteCodeWriter::ElementScopedU(this_00,LdElemUndefScoped,uVar4);
                }
                else {
                  Js::ByteCodeWriter::ElementRootU(this_00,LdLocalElemUndef,uVar4);
                }
              }
            }
            else {
              bVar3 = Symbol::IsArguments(this_03);
              if (bVar3) {
                bVar3 = ShouldTrackDebuggerMetadata(this);
                if ((bVar3) && ((this_03->field_0x42 & 0x80) == 0)) {
                  bVar3 = Symbol::IsInSlot(this_03,this,funcInfo,false);
                  if ((!bVar3) && (this_03->location != 0xffffffff)) {
                    Js::FunctionBody::InsertSymbolToRegSlotList
                              (this_02,&this_03->name,this_03->location,funcInfo->varRegsCount);
                  }
                }
              }
              else {
                bVar3 = Symbol::NeedsSlotAlloc(this_03,this,funcInfo);
                uVar9 = *(ushort *)&this_03->field_0x42;
                if (bVar3) {
                  if ((uVar9 >> 0xb & 1) == 0) {
LAB_0075c5ad:
                    uVar9 = uVar9 | 0x400;
                    *(ushort *)&this_03->field_0x42 = uVar9;
                  }
                  else if (this_03->hasFuncAssignment == true) {
                    pFVar7 = FuncInfo::GetParsedFunctionBody(funcInfo);
                    uVar9 = *(ushort *)&this_03->field_0x42;
                    if (((pFVar7->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) !=
                        Flags_None) goto LAB_0075c5ad;
                  }
                }
                if ((char)uVar9 < '\0') {
LAB_0075c5fe:
                  if (((funcInfo->bodyScope->field_0x44 & 2) == 0) ||
                     ((funcInfo->field_0xb5 & 1) != 0)) goto LAB_0075c6fc;
                }
                else {
                  bVar3 = Symbol::IsInSlot(this_03,this,funcInfo,false);
                  if (bVar3) goto LAB_0075c5fe;
                }
                R0 = this_03->location;
                if (R0 == 0xffffffff) {
                  bVar3 = Symbol::IsInSlot(this_03,this,funcInfo,false);
                  if (!bVar3) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar5 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                       ,0x5a8,"(sym->IsInSlot(this, funcInfo))",
                                       "sym->IsInSlot(this, funcInfo)");
                    if (!bVar3) {
LAB_0075c766:
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    *puVar5 = 0;
                  }
                  R0 = FuncInfo::AcquireTmpRegister(funcInfo);
                }
                Js::ByteCodeWriter::Reg1(this_00,LdUndef,R0);
                EmitLocalPropInit(this,R0,this_03,funcInfo);
                bVar3 = ShouldTrackDebuggerMetadata(this);
                if ((bVar3) && ((this_03->field_0x42 & 0x80) == 0)) {
                  bVar3 = Symbol::IsInSlot(this_03,this,funcInfo,false);
                  if (!bVar3) {
                    Js::FunctionBody::InsertSymbolToRegSlotList
                              (this_02,&this_03->name,R0,funcInfo->varRegsCount);
                  }
                }
                FuncInfo::ReleaseTmpRegister(funcInfo,R0);
              }
            }
LAB_0075c6fc:
            this_03->field_0x42 = this_03->field_0x42 | 0x80;
          }
        }
      }
    }
LAB_0075c701:
    pPVar6 = ParseNode::AsParseNodeVar(this_01);
    ppPVar10 = &pPVar6->pnodeNext;
  } while( true );
}

Assistant:

void ByteCodeGenerator::DefineUserVars(FuncInfo *funcInfo)
{
    // Initialize scope-wide variables on entry to the scope. TODO: optimize by detecting uses that are always reached
    // by an existing initialization.

    BOOL fGlobal = funcInfo->IsGlobalFunction();
    ParseNode *pnode;
    Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
    // Global declarations need a temp register to hold the init value, but the node shouldn't get a register.
    // Just assign one on the fly and re-use it for all initializations.
    Js::RegSlot tmpReg = fGlobal ? funcInfo->AcquireTmpRegister() : Js::Constants::NoRegister;

    for (pnode = funcInfo->root->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
    {
        Symbol* sym = pnode->AsParseNodeVar()->sym;

        if (sym != nullptr && !(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
        {
            if (sym->IsSpecialSymbol())
            {
                // Special symbols have already had their initial values stored into their registers.
                // In default-argument case we've stored those values into their slot locations, as well.
                // We must do that because a default parameter may access a special symbol through a scope slot.
                // In the non-default-argument case, though, we didn't yet store the values into the
                // slots so let's do that now.
                if (!funcInfo->root->HasNonSimpleParameterList())
                {
                    EmitPropStoreForSpecialSymbol(sym->GetLocation(), sym, sym->GetPid(), funcInfo, true);

                    if (ShouldTrackDebuggerMetadata() && !sym->IsInSlot(this, funcInfo))
                    {
                        byteCodeFunction->InsertSymbolToRegSlotList(sym->GetName(), sym->GetLocation(), funcInfo->varRegsCount);
                    }
                }

                continue;
            }

            if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
            {
                // The init node was bound to the catch object, because it's inside a catch and has the
                // same name as the catch object. But we want to define a user var at function scope,
                // so find the right symbol. (We'll still assign the RHS value to the catch object symbol.)
                // This also applies to a var declaration in the same scope as a let declaration.
#if DBG
                if (sym->IsArguments())
                {
                    // There is a block scoped var named arguments
                    Assert(!funcInfo->GetHasArguments());
                    continue;
                }
                else if (!sym->GetIsCatch())
                {
                    // Assert that catch cannot be at function scope and let and var at function scope is redeclaration error.
                    Assert(funcInfo->bodyScope != sym->GetScope());
                }
#endif
                sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                Assert(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar());
            }

            if (sym->GetSymbolType() == STVariable && !sym->GetIsModuleExportStorage())
            {
                if (fGlobal)
                {
                    Js::PropertyId propertyId = sym->EnsurePosition(this);

                    // We do need to initialize some globals to avoid JS errors on loading undefined variables.
                    // But we first need to make sure we're not trashing built-ins.

                    if (this->flags & fscrEval)
                    {
                        if (funcInfo->byteCodeFunction->GetIsStrictMode())
                        {
                            // Check/Init the property of the frame object
                            this->m_writer.ElementRootU(Js::OpCode::LdLocalElemUndef,
                                funcInfo->FindOrAddReferencedPropertyId(propertyId));
                        }
                        else
                        {
                            // The check and the init involve the first element in the scope chain.
                            this->m_writer.ElementScopedU(
                                Js::OpCode::LdElemUndefScoped, funcInfo->FindOrAddReferencedPropertyId(propertyId));
                        }
                    }
                    else
                    {
                        this->m_writer.ElementU(Js::OpCode::LdElemUndef, ByteCodeGenerator::RootObjectRegister,
                            funcInfo->FindOrAddReferencedPropertyId(propertyId));
                    }
                }
                else if (!sym->IsArguments())
                {
                    if (sym->NeedsSlotAlloc(this, funcInfo))
                    {
                        if (!sym->GetHasNonCommittedReference() ||
                            (sym->GetHasFuncAssignment() && funcInfo->GetParsedFunctionBody()->DoStackNestedFunc()))
                        {
                            // No point in trying to optimize if there are no references before we have to commit to slot.
                            // And not safe to delay putting a stack function in the slot, since we may miss boxing.
                            sym->SetIsCommittedToSlot();
                        }
                    }

                    // Undef-initialize the home location if it is a register (not closure-captured, or else capture
                    // is delayed) or a property of an object.
                    if ((!sym->GetHasInit() && !sym->IsInSlot(this, funcInfo)) ||
                        (funcInfo->bodyScope->GetIsObject() && !funcInfo->GetHasCachedScope()))
                    {
                        Js::RegSlot reg = sym->GetLocation();
                        if (reg == Js::Constants::NoRegister)
                        {
                            Assert(sym->IsInSlot(this, funcInfo));
                            reg = funcInfo->AcquireTmpRegister();
                        }
                        this->m_writer.Reg1(Js::OpCode::LdUndef, reg);
                        this->EmitLocalPropInit(reg, sym, funcInfo);

                        if (ShouldTrackDebuggerMetadata() && !sym->GetHasInit() && !sym->IsInSlot(this, funcInfo))
                        {
                            byteCodeFunction->InsertSymbolToRegSlotList(sym->GetName(), reg, funcInfo->varRegsCount);
                        }

                        funcInfo->ReleaseTmpRegister(reg);
                    }
                }
                else if (ShouldTrackDebuggerMetadata())
                {
                    if (!sym->GetHasInit() && !sym->IsInSlot(this, funcInfo))
                    {
                        Js::RegSlot reg = sym->GetLocation();
                        if (reg != Js::Constants::NoRegister)
                        {
                            byteCodeFunction->InsertSymbolToRegSlotList(sym->GetName(), reg, funcInfo->varRegsCount);
                        }
                    }
                }
                sym->SetHasInit(TRUE);
            }
        }

    }
    if (tmpReg != Js::Constants::NoRegister)
    {
        funcInfo->ReleaseTmpRegister(tmpReg);
    }

    for (int i = 0; i < funcInfo->nonUserNonTempRegistersToInitialize.Count(); ++i)
    {
        m_writer.Reg1(Js::OpCode::LdUndef, funcInfo->nonUserNonTempRegistersToInitialize.Item(i));
    }
}